

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

char * StringToUnicode(char *cc,int size)

{
  long lVar1;
  byte *pbVar2;
  int iVar3;
  int local_24;
  
  TArray<char,_char>::Clear(&out);
  lVar1 = 0;
  iVar3 = 0;
  do {
    if (cc[lVar1] == 0) {
      size = (int)lVar1;
      break;
    }
    iVar3 = iVar3 + (uint)((byte)cc[lVar1] >> 7) + 1;
    lVar1 = lVar1 + 1;
  } while (size != (int)lVar1);
  if (iVar3 != size) {
    TArray<char,_char>::Resize(&out,iVar3 + 1);
    out.Array[out.Count - 1] = '\0';
    iVar3 = 0;
    for (pbVar2 = (byte *)cc; cc = out.Array, *pbVar2 != 0; pbVar2 = pbVar2 + 1) {
      utf8_encode((uint)*pbVar2,out.Array + iVar3,&local_24);
      iVar3 = iVar3 + size;
    }
  }
  return cc;
}

Assistant:

static const char *StringToUnicode(const char *cc, int size = -1)
{
	int ch;
	const char *c = cc;
	int count = 0;
	int count1 = 0;
	out.Clear();
	while ((ch = (*c++) & 255))
	{
		count1++;
		if (ch >= 128)
		{
			if (ch < 0x800) count += 2;
			else count += 3;
			// The source cannot contain 4-byte chars.
		}
		else count++;
		if (count1 == size && size > 0) break;
	}
	if (count == count1) return cc;	// string is pure ASCII.
	// we need to convert
	out.Resize(count + 1);
	out.Last() = 0;
	c = cc;
	int i = 0;
	while ((ch = (*c++) & 255))
	{
		utf8_encode(ch, &out[i], &count1);
		i += count1;
	}
	return &out[0];
}